

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_ts__teardown_end(fct_ts_t *ts)

{
  if (ts->mode != ts_mode_abort) {
    if (ts->mode == ts_mode_end) {
      __assert_fail("!((ts)->mode == ts_mode_end)",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x491,"int fct_ts__is_more_tests(const fct_ts_t *)");
    }
    ts->mode = (uint)(ts->total_test_num <= ts->curr_test_num) * 3 + ts_mode_setup;
  }
  return;
}

Assistant:

static void
fct_ts__teardown_end(fct_ts_t *ts)
{
    if ( ts->mode == ts_mode_abort )
    {
        return; /* Because we are aborting . */
    }
    /* We have to decide if we should keep on testing by moving into tear down
    mode or if we have reached the real end and should be moving into the
    ending mode. */
    if ( fct_ts__is_more_tests(ts) )
    {
        ts->mode = ts_mode_setup;
    }
    else
    {
        ts->mode = ts_mode_ending;
    }
}